

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

void p_bre(parse *p,int end1,int end2)

{
  int *piVar1;
  size_t opnd;
  long lVar2;
  re_guts *prVar3;
  size_t sVar4;
  int from;
  int iVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  bool bVar10;
  byte *pbVar11;
  ulong opnd_00;
  uint uVar12;
  char *pcVar13;
  sopno start;
  bool bVar14;
  
  lVar2 = p->slen;
  pbVar7 = (byte *)p->next;
  pbVar9 = (byte *)p->end;
  if ((pbVar7 < pbVar9) && (*pbVar7 == 0x5e)) {
    p->next = (char *)(pbVar7 + 1);
    doemit(p,0xc000000,0);
    prVar3 = p->g;
    piVar1 = &prVar3->iflags;
    *piVar1 = *piVar1 | 1;
    piVar1 = &prVar3->nbol;
    *piVar1 = *piVar1 + 1;
    pbVar7 = (byte *)p->next;
    pbVar9 = (byte *)p->end;
  }
  if (pbVar7 < pbVar9) {
    bVar14 = false;
    bVar10 = false;
    do {
      pcVar13 = (char *)(pbVar7 + 1);
      if (pcVar13 < pbVar9) {
        if (((char)*pbVar7 == end1) && (*pcVar13 == end2)) break;
        start = p->slen;
        p->next = pcVar13;
        uVar12 = (uint)(char)*pbVar7;
        if (uVar12 == 0x5c) {
LAB_001042e1:
          p->next = (char *)((byte *)pcVar13 + 1);
          uVar12 = (byte)*pcVar13 | 0x100;
        }
      }
      else {
        start = p->slen;
        p->next = pcVar13;
        uVar12 = (uint)(char)*pbVar7;
        if (uVar12 == 0x5c) {
          if (p->error == 0) {
            p->error = 5;
          }
          p->end = nuls;
          pcVar13 = nuls;
          goto LAB_001042e1;
        }
      }
      if ((int)uVar12 < 0x131) {
        if ((int)uVar12 < 0x5b) {
          if (uVar12 == 0x2a) {
            if (bVar10) {
              if (p->error == 0) {
                p->error = 0xd;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          else if (uVar12 == 0x2e) {
            if ((p->g->cflags & 8) == 0) {
              doemit(p,0x14000000,0);
            }
            else {
              nonnewline(p);
            }
            goto LAB_00104564;
          }
LAB_0010446d:
          ordinary(p,(int)(char)uVar12);
        }
        else if (uVar12 == 0x5b) {
          p_bracket(p);
        }
        else {
          if (uVar12 != 0x128) {
            if (uVar12 == 0x129) goto LAB_00104417;
            goto LAB_0010446d;
          }
          sVar4 = p->g->nsub;
          opnd = sVar4 + 1;
          p->g->nsub = opnd;
          if ((long)opnd < 10) {
            p->pbegin[sVar4 + 1] = start;
          }
          doemit(p,0x34000000,opnd);
          pcVar13 = p->next;
          if ((pcVar13 < p->end) &&
             (((p->end <= pcVar13 + 1 || (*pcVar13 != '\\')) || (pcVar13[1] != ')')))) {
            p_bre(p,0x5c,0x29);
          }
          if (((long)opnd < 10) && (lVar8 = p->slen, p->pend[sVar4 + 1] = lVar8, lVar8 == 0)) {
            __assert_fail("p->pend[subno] != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x1f8,"int p_simp_re()");
          }
          doemit(p,0x38000000,opnd);
          pcVar13 = p->next;
          if (((p->end <= pcVar13) || (p->end <= pcVar13 + 1)) ||
             ((*pcVar13 != '\\' || (pcVar13[1] != ')')))) {
            if (p->error != 0) goto LAB_0010455d;
            goto LAB_00104556;
          }
          p->next = pcVar13 + 2;
        }
      }
      else if (uVar12 - 0x131 < 9) {
        if (0x39 < (uVar12 & 0xfffffeff)) {
          __assert_fail("i < NPAREN",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x20b,"int p_simp_re()");
        }
        opnd_00 = (ulong)((uVar12 & 0xfffffeff) - 0x30);
        if (p->pend[opnd_00] == 0) {
          if (p->error == 0) {
            p->error = 6;
          }
          p->next = nuls;
          p->end = nuls;
        }
        else {
          if (p->g->nsub < opnd_00) {
            __assert_fail("(size_t) i <= p->g->nsub",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x20d,"int p_simp_re()");
          }
          doemit(p,0x1c000000,opnd_00);
          lVar8 = p->pbegin[opnd_00];
          if (lVar8 == 0) {
            __assert_fail("p->pbegin[i] != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x20f,"int p_simp_re()");
          }
          if ((*(uint *)(p->strip + lVar8) & 0x7c000000) != 0x34000000) {
            __assert_fail("OP(p->strip[p->pbegin[i]]) == OLPAREN",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x210,"int p_simp_re()");
          }
          if ((*(uint *)(p->strip + p->pend[opnd_00]) & 0x7c000000) != 0x38000000) {
            __assert_fail("OP(p->strip[p->pend[i]]) == ORPAREN",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x211,"int p_simp_re()");
          }
          dupl(p,lVar8 + 1,p->pend[opnd_00]);
          doemit(p,0x20000000,opnd_00);
        }
        p->g->backrefs = 1;
      }
      else {
        if (uVar12 == 0x17b) {
          if (p->error == 0) {
            p->error = 0xd;
          }
        }
        else {
          if (uVar12 != 0x17d) goto LAB_0010446d;
LAB_00104417:
          if (p->error == 0) {
LAB_00104556:
            p->error = 8;
          }
        }
LAB_0010455d:
        p->next = nuls;
        p->end = nuls;
      }
LAB_00104564:
      pbVar7 = (byte *)p->next;
      pbVar9 = (byte *)p->end;
      if (pbVar7 < pbVar9) {
        pbVar11 = pbVar7 + 1;
        if (*pbVar7 == 0x2a) {
          p->next = (char *)pbVar11;
          doinsert(p,0x24000000,(p->slen - start) + 1,start);
          doemit(p,0x28000000,p->slen - start);
          doinsert(p,0x2c000000,(p->slen - start) + 1,start);
          doemit(p,0x30000000,p->slen - start);
          pbVar7 = (byte *)p->next;
          pbVar9 = (byte *)p->end;
          bVar14 = false;
        }
        else {
          if ((*pbVar7 != 0x5c || pbVar9 <= pbVar11) || (*pbVar11 != 0x7b)) goto LAB_001046c1;
          p->next = (char *)(pbVar7 + 2);
          from = p_count(p);
          pcVar13 = p->next;
          iVar5 = from;
          if ((pcVar13 < p->end) && (*pcVar13 == ',')) {
            pcVar13 = pcVar13 + 1;
            p->next = pcVar13;
            iVar5 = 0x100;
            if ((pcVar13 < p->end) &&
               ((ppuVar6 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar6 + (long)*pcVar13 * 2 + 1) & 8) != 0 &&
                (iVar5 = p_count(p), iVar5 < from)))) {
              if (p->error == 0) {
                p->error = 10;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          repeat(p,start,from,iVar5);
          pbVar7 = (byte *)p->next;
          pbVar9 = (byte *)p->end;
          if (pbVar9 <= pbVar7) goto LAB_00104708;
          pbVar11 = pbVar7 + 1;
          if (((pbVar9 <= pbVar11) || (*pbVar7 != 0x5c)) || (*pbVar11 != 0x7d)) goto LAB_001046e5;
          pbVar7 = pbVar7 + 2;
          p->next = (char *)pbVar7;
          bVar14 = false;
        }
      }
      else {
LAB_001046c1:
        bVar14 = uVar12 == 0x24;
      }
      bVar10 = true;
    } while (pbVar7 < pbVar9);
    lVar8 = p->slen;
    if (!bVar14) goto LAB_0010475d;
    p->slen = lVar8 + -1;
    doemit(p,0x10000000,0);
    prVar3 = p->g;
    piVar1 = &prVar3->iflags;
    *piVar1 = *piVar1 | 2;
    piVar1 = &prVar3->neol;
    *piVar1 = *piVar1 + 1;
  }
  goto LAB_00104759;
  while( true ) {
    p->next = (char *)pbVar11;
    bVar14 = pbVar11 == pbVar9;
    pbVar11 = pbVar11 + 1;
    if (bVar14) break;
LAB_001046e5:
    if (((pbVar11 < pbVar9) && (pbVar11[-1] == 0x5c)) && (*pbVar11 == 0x7d)) {
      if (p->error != 0) goto LAB_0010471b;
      iVar5 = 10;
      goto LAB_00104718;
    }
  }
LAB_00104708:
  if (p->error == 0) {
    iVar5 = 9;
LAB_00104718:
    p->error = iVar5;
  }
LAB_0010471b:
  p->next = nuls;
  p->end = nuls;
LAB_00104759:
  lVar8 = p->slen;
LAB_0010475d:
  if (lVar8 == lVar2) {
    if (p->error == 0) {
      p->error = 0xe;
    }
    p->next = nuls;
    p->end = nuls;
  }
  return;
}

Assistant:

static void
p_bre(p, end1, end2)
struct parse *p;
int end1;		/* first terminating character */
int end2;		/* second terminating character */
{
	sopno start = HERE();
	int first = 1;			/* first subexpression? */
	int wasdollar = 0;

	if (EAT('^')) {
		EMIT(OBOL, 0);
		p->g->iflags |= USEBOL;
		p->g->nbol++;
	}
	while (MORE() && !SEETWO(end1, end2)) {
		wasdollar = p_simp_re(p, first);
		first = 0;
	}
	if (wasdollar) {	/* oops, that was a trailing anchor */
		DROP(1);
		EMIT(OEOL, 0);
		p->g->iflags |= USEEOL;
		p->g->neol++;
	}

	REQUIRE(HERE() != start, REG_EMPTY);	/* require nonempty */
}